

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scan.cpp
# Opt level: O0

int __thiscall glslang::TScanContext::dMat(TScanContext *this)

{
  bool bVar1;
  uint uVar2;
  TScanContext *this_local;
  
  this->afterType = true;
  bVar1 = TParseVersions::isEsProfile(&this->parseContext->super_TParseVersions);
  if ((bVar1) && (299 < (this->parseContext->super_TParseVersions).version)) {
    reservedWord(this);
    this_local._4_4_ = this->keyword;
  }
  else {
    bVar1 = TParseVersions::isEsProfile(&this->parseContext->super_TParseVersions);
    if ((bVar1) ||
       (((((this->parseContext->super_TParseVersions).version < 400 &&
          (bVar1 = TSymbolTable::atBuiltInLevel(this->parseContext->symbolTable), !bVar1)) &&
         (((this->parseContext->super_TParseVersions).version < 0x96 ||
          (uVar2 = (*(this->parseContext->super_TParseVersions)._vptr_TParseVersions[8])
                             (this->parseContext,"GL_ARB_gpu_shader_fp64"), (uVar2 & 1) == 0)))) &&
        ((((this->parseContext->super_TParseVersions).version < 0x96 ||
          (uVar2 = (*(this->parseContext->super_TParseVersions)._vptr_TParseVersions[8])
                             (this->parseContext,"GL_ARB_vertex_attrib_64bit"), (uVar2 & 1) == 0))
         || ((this->parseContext->super_TParseVersions).language != EShLangVertex)))))) {
      bVar1 = TParseVersions::isForwardCompatible(&this->parseContext->super_TParseVersions);
      if (bVar1) {
        (*(this->parseContext->super_TParseVersions)._vptr_TParseVersions[0x2e])
                  (this->parseContext,&this->loc,"using future type keyword",this->tokenText,"");
      }
      this_local._4_4_ = identifierOrType(this);
    }
    else {
      this_local._4_4_ = this->keyword;
    }
  }
  return this_local._4_4_;
}

Assistant:

int TScanContext::dMat()
{
    afterType = true;

    if (parseContext.isEsProfile() && parseContext.version >= 300) {
        reservedWord();

        return keyword;
    }

    if (!parseContext.isEsProfile() && (parseContext.version >= 400 ||
        parseContext.symbolTable.atBuiltInLevel() ||
        (parseContext.version >= 150 && parseContext.extensionTurnedOn(E_GL_ARB_gpu_shader_fp64)) ||
        (parseContext.version >= 150 && parseContext.extensionTurnedOn(E_GL_ARB_vertex_attrib_64bit)
         && parseContext.language == EShLangVertex)))
        return keyword;

    if (parseContext.isForwardCompatible())
        parseContext.warn(loc, "using future type keyword", tokenText, "");

    return identifierOrType();
}